

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O2

int rd_contents(archive_read *a,void **buff,size_t *size,size_t *used,uint64_t remaining)

{
  void *pvVar1;
  int error_number;
  uint uVar2;
  void *__src;
  void *pvVar3;
  char *pcVar4;
  size_t sVar5;
  ulong __n;
  ssize_t bytes;
  
  __src = __archive_read_ahead(a,1,&bytes);
  if (bytes < 0) goto LAB_00134959;
  if (bytes == 0) {
    pcVar4 = "Truncated archive file";
    error_number = -1;
LAB_0013477c:
    archive_set_error(&a->archive,error_number,pcVar4);
LAB_00134787:
    bytes = -0x1e;
  }
  else {
    if (remaining < (ulong)bytes) {
      bytes = remaining;
    }
    __n = bytes;
    *used = bytes;
    pvVar1 = a->format->data;
    pvVar3 = *buff;
    if (pvVar3 == (void *)0x0) {
      pvVar3 = *(void **)((long)pvVar1 + 0x20);
      if (pvVar3 == (void *)0x0) {
        pvVar3 = malloc(0x10000);
        *(void **)((long)pvVar1 + 0x20) = pvVar3;
        if (pvVar3 == (void *)0x0) {
          pcVar4 = "Couldn\'t allocate memory for out buffer";
          error_number = 0xc;
          goto LAB_0013477c;
        }
      }
      *buff = pvVar3;
      sVar5 = 0x10000;
    }
    else {
      sVar5 = *size;
    }
    if (*(int *)((long)pvVar1 + 0x60) - 3U < 2) {
      *(void **)((long)pvVar1 + 0xe0) = __src;
      *(ulong *)((long)pvVar1 + 0xe8) = __n;
      *(void **)((long)pvVar1 + 0xf8) = pvVar3;
      *(size_t *)((long)pvVar1 + 0x100) = sVar5;
      uVar2 = lzma_code((long)pvVar1 + 0xe0,0);
      if (uVar2 != 0) {
        if (uVar2 != 1) {
          pcVar4 = "application/x-lzma";
          if (*(int *)((long)pvVar1 + 0x1f8) == 4) {
            pcVar4 = "application/x-xz";
          }
          archive_set_error(&a->archive,-1,"%s decompression failed(%d)",pcVar4 + 0xe,(ulong)uVar2);
          goto LAB_00134787;
        }
        lzma_end((long)pvVar1 + 0xe0);
        *(undefined4 *)((long)pvVar1 + 0x168) = 0;
      }
      *used = __n - *(long *)((long)pvVar1 + 0xe8);
      __n = sVar5 - *(long *)((long)pvVar1 + 0x100);
    }
    else if (*(int *)((long)pvVar1 + 0x60) == 1) {
      *(void **)((long)pvVar1 + 0x68) = __src;
      *(int *)((long)pvVar1 + 0x70) = (int)__n;
      *(void **)((long)pvVar1 + 0x80) = pvVar3;
      *(int *)((long)pvVar1 + 0x88) = (int)sVar5;
      uVar2 = inflate((long)pvVar1 + 0x68,0);
      if (1 < uVar2) {
        archive_set_error(&a->archive,-1,"File decompression failed (%d)",(ulong)uVar2);
        goto LAB_00134787;
      }
      *used = __n - *(uint *)((long)pvVar1 + 0x70);
      __n = sVar5 - *(uint *)((long)pvVar1 + 0x88);
    }
    else if (pvVar3 == *(void **)((long)pvVar1 + 0x20)) {
      *buff = __src;
    }
    else {
      if (sVar5 < __n) {
        __n = sVar5;
      }
      memcpy(pvVar3,__src,__n);
      *used = __n;
    }
    *size = __n;
    pvVar1 = *buff;
    pvVar3 = a->format->data;
    _checksum_update((chksumwork *)((long)pvVar3 + 0x170),__src,*used);
    _checksum_update((chksumwork *)((long)pvVar3 + 0x188),pvVar1,__n);
    bytes = 0;
  }
LAB_00134959:
  return (int)bytes;
}

Assistant:

static int
rd_contents(struct archive_read *a, const void **buff, size_t *size,
    size_t *used, uint64_t remaining)
{
	const unsigned char *b;
	ssize_t bytes;

	/* Get whatever bytes are immediately available. */
	b = __archive_read_ahead(a, 1, &bytes);
	if (bytes < 0)
		return ((int)bytes);
	if (bytes == 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Truncated archive file");
		return (ARCHIVE_FATAL);
	}
	if ((uint64_t)bytes > remaining)
		bytes = (ssize_t)remaining;

	/*
	 * Decompress contents of file.
	 */
	*used = bytes;
	if (decompress(a, buff, size, b, used) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	/*
	 * Update checksum of a compressed data and a extracted data.
	 */
	checksum_update(a, b, *used, *buff, *size);

	return (ARCHIVE_OK);
}